

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.c
# Opt level: O1

SUNErrCode SUNContext_Create(SUNComm comm,SUNContext *sunctx_out)

{
  int iVar1;
  SUNContext __ptr;
  SUNLogger logger;
  SUNErrHandler_conflict eh;
  SUNLogger local_30;
  SUNErrHandler_conflict local_28;
  
  local_30 = (SUNLogger)0x0;
  local_28 = (SUNErrHandler_conflict)0x0;
  *sunctx_out = (SUNContext)0x0;
  __ptr = (SUNContext)malloc(0x30);
  if (__ptr == (SUNContext)0x0) {
    iVar1 = -0x2704;
  }
  else {
    iVar1 = SUNLogger_CreateFromEnv(0,&local_30);
    if (iVar1 == 0) {
      iVar1 = SUNErrHandler_Create(SUNLogErrHandlerFn,(void *)0x0,&local_28);
      if (iVar1 == 0) {
        __ptr->logger = local_30;
        __ptr->own_logger = (uint)(local_30 != (SUNLogger)0x0);
        __ptr->profiler = (SUNProfiler)0x0;
        __ptr->own_profiler = 0;
        __ptr->last_err = 0;
        __ptr->err_handler = local_28;
        __ptr->comm = comm;
        iVar1 = 0;
      }
    }
    if (iVar1 == 0) {
      *sunctx_out = __ptr;
    }
    else {
      SUNLogger_Destroy(&local_30);
      free(__ptr);
    }
  }
  return iVar1;
}

Assistant:

SUNErrCode SUNContext_Create(SUNComm comm, SUNContext* sunctx_out)
{
  SUNErrCode err       = SUN_SUCCESS;
  SUNProfiler profiler = NULL;
  SUNLogger logger     = NULL;
  SUNContext sunctx    = NULL;
  SUNErrHandler eh     = NULL;

  *sunctx_out = NULL;
  sunctx      = (SUNContext)malloc(sizeof(struct SUNContext_));

  /* SUNContext_Create cannot assert or log since the SUNContext is not yet
   * created */
  if (!sunctx) { return SUN_ERR_MALLOC_FAIL; }

  SUNFunctionBegin(sunctx);

#ifdef SUNDIALS_ADIAK_ENABLED
  adiak_init(&comm);
  sunAdiakCollectMetadata();
#endif

  do {
#if SUNDIALS_LOGGING_LEVEL > 0
#if SUNDIALS_MPI_ENABLED
    err = SUNLogger_CreateFromEnv(comm, &logger);
    SUNCheckCallNoRet(err);
    if (err) { break; }
#else
    err = SUNLogger_CreateFromEnv(SUN_COMM_NULL, &logger);
    SUNCheckCallNoRet(err);
    if (err) { break; }
#endif
#else
    err = SUNLogger_Create(SUN_COMM_NULL, 0, &logger);
    SUNCheckCallNoRet(err);
    if (err) { break; }
    err = SUNLogger_SetErrorFilename(logger, "");
    SUNCheckCallNoRet(err);
    if (err) { break; }
    err = SUNLogger_SetWarningFilename(logger, "");
    SUNCheckCallNoRet(err);
    if (err) { break; }
    err = SUNLogger_SetInfoFilename(logger, "");
    SUNCheckCallNoRet(err);
    if (err) { break; }
    err = SUNLogger_SetDebugFilename(logger, "");
    SUNCheckCallNoRet(err);
    if (err) { break; }
#endif

#if defined(SUNDIALS_BUILD_WITH_PROFILING) && !defined(SUNDIALS_CALIPER_ENABLED)
    err = SUNProfiler_Create(comm, "SUNContext Default", &profiler);
    SUNCheckCallNoRet(err);
    if (err) { break; }
#endif

    err = SUNErrHandler_Create(SUNLogErrHandlerFn, NULL, &eh);
    SUNCheckCallNoRet(err);
    if (err) { break; }

    sunctx->logger       = logger;
    sunctx->own_logger   = logger != NULL;
    sunctx->profiler     = profiler;
    sunctx->own_profiler = profiler != NULL;
    sunctx->last_err     = SUN_SUCCESS;
    sunctx->err_handler  = eh;
    sunctx->comm         = comm;
  }
  while (0);

  if (err)
  {
#if defined(SUNDIALS_BUILD_WITH_PROFILING) && !defined(SUNDIALS_CALIPER_ENABLED)
    SUNCheckCallNoRet(SUNProfiler_Free(&profiler));
#endif
    SUNCheckCallNoRet(SUNLogger_Destroy(&logger));
    free(sunctx);
  }
  else { *sunctx_out = sunctx; }

  return err;
}